

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadCellIsThreeState(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  Scl_Item_t *pSVar3;
  int *piVar4;
  
  piVar4 = &pCell->Child;
  do {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"pin");
    if (iVar1 == 0) {
      piVar4 = &pSVar2->Child;
      while (pSVar3 = Scl_LibertyItem(p,*piVar4), pSVar3 != (Scl_Item_t *)0x0) {
        iVar1 = Scl_LibertyCompare(p,pSVar3->Key,"three_state");
        piVar4 = &pSVar3->Next;
        if (iVar1 == 0) {
          return 1;
        }
      }
    }
    piVar4 = &pSVar2->Next;
  } while( true );
}

Assistant:

int Scl_LibertyReadCellIsThreeState( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pPin, * pItem;
    Scl_ItemForEachChildName( p, pCell, pPin, "pin" )
        Scl_ItemForEachChildName( p, pPin, pItem, "three_state" )
            return 1;
    return 0;
}